

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O2

bool __thiscall
acto::actor_ref::send_message_on_behalf
          (actor_ref *this,object_t *sender,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  object_t *target;
  bool bVar1;
  runtime_t *this_00;
  _Head_base<0UL,_acto::core::msg_t_*,_false> local_20;
  
  this_00 = core::runtime_t::instance();
  target = this->object_;
  local_20._M_head_impl =
       (msg->_M_t).super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>
       ._M_t.super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
       super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl;
  (msg->_M_t).super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t
  .super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
  super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl = (msg_t *)0x0;
  bVar1 = core::runtime_t::send_on_behalf
                    (this_00,target,sender,
                     (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)
                     &local_20);
  if (local_20._M_head_impl != (msg_t *)0x0) {
    (*(local_20._M_head_impl)->_vptr_msg_t[1])();
  }
  return bVar1;
}

Assistant:

bool actor_ref::send_message_on_behalf(core::object_t* sender,
                                       std::unique_ptr<core::msg_t> msg) const {
  return core::runtime_t::instance()->send_on_behalf(object_, sender,
                                                     std::move(msg));
}